

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileTimes.cxx
# Opt level: O2

bool cmFileTimes::Copy(string *fromFile,string *toFile)

{
  bool bVar1;
  cmFileTimes fileTimes;
  _Head_base<0UL,_cmFileTimes::Times_*,_false> local_10;
  
  local_10._M_head_impl = (Times *)0x0;
  bVar1 = Load((cmFileTimes *)&local_10,fromFile);
  if (bVar1) {
    bVar1 = Store((cmFileTimes *)&local_10,toFile);
  }
  else {
    bVar1 = false;
  }
  std::unique_ptr<cmFileTimes::Times,_std::default_delete<cmFileTimes::Times>_>::~unique_ptr
            ((unique_ptr<cmFileTimes::Times,_std::default_delete<cmFileTimes::Times>_> *)&local_10);
  return bVar1;
}

Assistant:

bool cmFileTimes::Copy(std::string const& fromFile, std::string const& toFile)
{
  cmFileTimes fileTimes;
  return (fileTimes.Load(fromFile) && fileTimes.Store(toFile));
}